

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O1

SizeT IA64_Convert(Byte *data,SizeT size,UInt32 ip,int encoding)

{
  byte bVar1;
  ulong in_RAX;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  byte *pbVar6;
  ulong uVar7;
  uint uVar8;
  byte *pbVar9;
  Byte *pBVar10;
  ulong uVar11;
  
  if (0xf < size) {
    in_RAX = 0;
    pBVar10 = data;
    do {
      bVar1 = ""[data[in_RAX] & 0x1f];
      uVar11 = 5;
      uVar8 = 0;
      do {
        if ((bVar1 >> (uVar8 & 0x1f) & 1) != 0) {
          pbVar9 = pBVar10 + (uVar11 >> 3);
          lVar3 = 0;
          uVar4 = 0;
          pbVar6 = pbVar9;
          do {
            uVar4 = uVar4 + ((ulong)*pbVar6 << ((byte)lVar3 & 0x3f));
            pbVar6 = pbVar6 + 1;
            lVar3 = lVar3 + 8;
          } while (lVar3 != 0x30);
          bVar2 = (byte)uVar11 & 7;
          uVar7 = uVar4 >> bVar2;
          if ((uVar7 & 0x1e000000e00) == 0xa000000000) {
            uVar5 = ((uint)(uVar7 >> 0x10) & 0x100000 | (uint)(uVar7 >> 0xd) & 0xfffff) * 0x10 -
                    (int)in_RAX >> 4;
            lVar3 = 0;
            do {
              *pbVar9 = (byte)((((ulong)(uVar5 & 0x100000) << 0x10 |
                                (ulong)(uVar5 & 0xfffff) << 0xd | uVar7 & 0xfffffeae000011ff) <<
                                bVar2 | (ulong)((uint)uVar4 & ~(-1 << bVar2))) >>
                              ((byte)lVar3 & 0x3f));
              lVar3 = lVar3 + 8;
              pbVar9 = pbVar9 + 1;
            } while (lVar3 != 0x30);
          }
        }
        uVar8 = uVar8 + 1;
        uVar11 = uVar11 + 0x29;
      } while (uVar8 != 3);
      in_RAX = in_RAX + 0x10;
      pBVar10 = pBVar10 + 0x10;
    } while (in_RAX <= size - 0x10);
  }
  return in_RAX;
}

Assistant:

static SizeT IA64_Convert(Byte *data, SizeT size, UInt32 ip, int encoding)
{
  SizeT i;
  if (size < 16)
    return 0;
  size -= 16;
  for (i = 0; i <= size; i += 16)
  {
    UInt32 instrTemplate = data[i] & 0x1F;
    UInt32 mask = kBranchTable[instrTemplate];
    UInt32 bitPos = 5;
    int slot;
    for (slot = 0; slot < 3; slot++, bitPos += 41)
    {
      UInt32 bytePos, bitRes;
      UInt64 instruction, instNorm;
      int j;
      if (((mask >> slot) & 1) == 0)
        continue;
      bytePos = (bitPos >> 3);
      bitRes = bitPos & 0x7;
      instruction = 0;
      for (j = 0; j < 6; j++)
        instruction += (UInt64)data[i + j + bytePos] << (8 * j);

      instNorm = instruction >> bitRes;
      if (((instNorm >> 37) & 0xF) == 0x5 && ((instNorm >> 9) & 0x7) == 0)
      {
        UInt32 src = (UInt32)((instNorm >> 13) & 0xFFFFF);
        UInt32 dest;
        src |= ((UInt32)(instNorm >> 36) & 1) << 20;
        
        src <<= 4;
        
        if (encoding)
          dest = ip + (UInt32)i + src;
        else
          dest = src - (ip + (UInt32)i);
        
        dest >>= 4;
        
        instNorm &= ~((UInt64)(0x8FFFFF) << 13);
        instNorm |= ((UInt64)(dest & 0xFFFFF) << 13);
        instNorm |= ((UInt64)(dest & 0x100000) << (36 - 20));
        
        instruction &= (1 << bitRes) - 1;
        instruction |= (instNorm << bitRes);
        for (j = 0; j < 6; j++)
          data[i + j + bytePos] = (Byte)(instruction >> (8 * j));
      }
    }
  }
  return i;
}